

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTWaveBank_GetState(FACTWaveBank *pWaveBank,uint32_t *pdwState)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *pdwState = 0;
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    *pdwState = 4;
    if ((ulong)pWaveBank->entryCount != 0) {
      uVar2 = 0;
      do {
        if (pWaveBank->entryRefs[uVar2] != 0) {
          *pdwState = 0x84;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pWaveBank->entryCount != uVar2);
    }
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t FACTWaveBank_GetState(
	FACTWaveBank *pWaveBank,
	uint32_t *pdwState
) {
	uint32_t i;
	if (pWaveBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pWaveBank->entryCount; i += 1)
	{
		if (pWaveBank->entryRefs[i] > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pWaveBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}